

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3ExprSkipCollate(Expr *pExpr)

{
  bool bVar1;
  Expr *local_10;
  Expr *pExpr_local;
  
  local_10 = pExpr;
  while( true ) {
    bVar1 = false;
    if (local_10 != (Expr *)0x0) {
      bVar1 = (local_10->flags & 0x1000) != 0;
    }
    if (!bVar1) break;
    if ((local_10->flags & 0x40000) == 0) {
      local_10 = local_10->pLeft;
    }
    else {
      local_10 = ((local_10->x).pList)->a[0].pExpr;
    }
  }
  return local_10;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprSkipCollate(Expr *pExpr){
  while( pExpr && ExprHasProperty(pExpr, EP_Skip) ){
    if( ExprHasProperty(pExpr, EP_Unlikely) ){
      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      assert( pExpr->x.pList->nExpr>0 );
      assert( pExpr->op==TK_FUNCTION );
      pExpr = pExpr->x.pList->a[0].pExpr;
    }else{
      assert( pExpr->op==TK_COLLATE );
      pExpr = pExpr->pLeft;
    }
  }   
  return pExpr;
}